

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O0

void duckdb_je_thread_tcache_max_set(tsd_t *tsd,size_t tcache_max)

{
  long lVar1;
  byte *in_RDI;
  byte bVar2;
  arena_t *assigned_arena;
  _Bool enabled;
  cache_bin_info_t duckdb_je_tcache_bin_info [73];
  tcache_slow_t *tcache_slow;
  tcache_t *tcache;
  uint8_t state;
  uint8_t state_1;
  arena_t *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  cache_bin_info_t *in_stack_fffffffffffffef8;
  tcache_t *in_stack_ffffffffffffff00;
  
  lVar1 = *(long *)(in_RDI + 0x360);
  memset(&stack0xfffffffffffffef8,0,0x92);
  bVar2 = (*in_RDI & 1) != 0;
  if ((bool)bVar2) {
    in_stack_fffffffffffffee8 = *(arena_t **)(lVar1 + 0x28);
    tcache_bin_settings_backup(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    duckdb_je_tcache_cleanup((tsd_t *)CONCAT17(bVar2,in_stack_fffffffffffffef0));
  }
  tcache_max_set((tcache_slow_t *)CONCAT17(bVar2,in_stack_fffffffffffffef0),
                 (size_t)in_stack_fffffffffffffee8);
  if ((bVar2 & 1) != 0) {
    duckdb_je_tsd_tcache_data_init
              ((tsd_t *)CONCAT17(bVar2,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8,
               (cache_bin_info_t *)0x25864da);
  }
  return;
}

Assistant:

void
thread_tcache_max_set(tsd_t *tsd, size_t tcache_max) {
	assert(tcache_max <= TCACHE_MAXCLASS_LIMIT);
	assert(tcache_max == sz_s2u(tcache_max));
	tcache_t *tcache = tsd_tcachep_get(tsd);
	tcache_slow_t *tcache_slow = tcache->tcache_slow;
	cache_bin_info_t tcache_bin_info[TCACHE_NBINS_MAX] = {{0}};
	assert(tcache != NULL && tcache_slow != NULL);

	bool enabled = tcache_available(tsd);
	arena_t *assigned_arena;
	if (enabled) {
		assigned_arena = tcache_slow->arena;
		/* Carry over the bin settings during the reboot. */
		tcache_bin_settings_backup(tcache, tcache_bin_info);
		/* Shutdown and reboot the tcache for a clean slate. */
		tcache_cleanup(tsd);
	}

	/*
	* Still set tcache_nbins of the tcache even if the tcache is not
	* available yet because the values are stored in tsd_t and are
	* always available for changing.
	*/
	tcache_max_set(tcache_slow, tcache_max);

	if (enabled) {
		tsd_tcache_data_init(tsd, assigned_arena, tcache_bin_info);
	}

	assert(tcache_nbins_get(tcache_slow) == sz_size2index(tcache_max) + 1);
}